

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O2

void __thiscall Assimp::OptimizeMeshesProcess::Execute(OptimizeMeshesProcess *this,aiScene *pScene)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
  *this_01;
  pointer pMVar1;
  uint uVar2;
  Logger *this_02;
  DeadlyImportError *this_03;
  int iVar3;
  size_t __n;
  uint i;
  ulong uVar4;
  ulong uVar5;
  pointer __src;
  char *message;
  pointer ppaVar6;
  long lVar7;
  long lVar8;
  char *local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  uVar4 = (ulong)pScene->mNumMeshes;
  this_02 = DefaultLogger::get();
  if (uVar4 < 2) {
    message = "Skipping OptimizeMeshesProcess";
  }
  else {
    Logger::debug(this_02,"OptimizeMeshesProcess begin");
    this->mScene = pScene;
    iVar3 = 0;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(&this->merge_list,0);
    this_00 = &this->output;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(this_00,0);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->merge_list,(ulong)pScene->mNumMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(this_00,(ulong)pScene->mNumMeshes);
    this_01 = &this->meshes;
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(this_01,(ulong)pScene->mNumMeshes);
    FindInstancedMeshes(this,pScene->mRootNode);
    if (this->max_verts == 0xdeadbeef) {
      this->max_verts = 0xffffffff;
    }
    lVar7 = 0;
    lVar8 = 0;
    for (uVar5 = 0; uVar5 < pScene->mNumMeshes; uVar5 = uVar5 + 1) {
      uVar2 = GetMeshVFormatUnique(*(aiMesh **)((long)pScene->mMeshes + lVar8));
      *(uint *)((long)&((this_01->
                        super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start)->vertex_format + lVar7) = uVar2;
      pMVar1 = (this_01->
               super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((1 < *(uint *)((long)&pMVar1->instance_cnt + lVar7)) &&
         (*(int *)((long)&pMVar1->output_id + lVar7) == -1)) {
        *(int *)((long)&pMVar1->output_id + lVar7) = iVar3;
        iVar3 = iVar3 + 1;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  (this_00,(value_type *)((long)this->mScene->mMeshes + lVar8));
      }
      lVar8 = lVar8 + 8;
      lVar7 = lVar7 + 0xc;
    }
    ProcessNode(this,pScene->mRootNode);
    if ((this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,
                 "OptimizeMeshes: No meshes remaining; there\'s definitely something wrong",
                 (allocator<char> *)local_1c8);
      DeadlyImportError::DeadlyImportError(this_03,(string *)&local_1a8);
      __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(this_01,0);
    uVar5 = (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar4 < uVar5) {
      __assert_fail("output.size() <= num_old",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/OptimizeMeshes.cpp"
                    ,0x94,"virtual void Assimp::OptimizeMeshesProcess::Execute(aiScene *)");
    }
    this->mScene->mNumMeshes = (uint)uVar5;
    __src = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    __n = (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__src;
    ppaVar6 = __src;
    if (__n != 0) {
      memmove(this->mScene->mMeshes,__src,__n);
      __src = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
      ppaVar6 = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    this_02 = DefaultLogger::get();
    if ((long)__src - (long)ppaVar6 >> 3 != uVar4) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[47]>
                (&local_1a8,(char (*) [47])"OptimizeMeshesProcess finished. Input meshes: ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", Output meshes: ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                 &pScene->mNumMeshes);
      std::__cxx11::stringbuf::str();
      Logger::debug(this_02,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      return;
    }
    message = "OptimizeMeshesProcess finished";
  }
  Logger::debug(this_02,message);
  return;
}

Assistant:

void OptimizeMeshesProcess::Execute( aiScene* pScene)
{
    const unsigned int num_old = pScene->mNumMeshes;
    if (num_old <= 1) {
        ASSIMP_LOG_DEBUG("Skipping OptimizeMeshesProcess");
        return;
    }

    ASSIMP_LOG_DEBUG("OptimizeMeshesProcess begin");
    mScene = pScene;

    // need to clear persistent members from previous runs
    merge_list.resize( 0 );
    output.resize( 0 );

    // ensure we have the right sizes
    merge_list.reserve(pScene->mNumMeshes);
    output.reserve(pScene->mNumMeshes);

    // Prepare lookup tables
    meshes.resize(pScene->mNumMeshes);
    FindInstancedMeshes(pScene->mRootNode);
    if( max_verts == DeadBeef ) /* undo the magic hack */
        max_verts = NotSet;

    // ... instanced meshes are immediately processed and added to the output list
    for (unsigned int i = 0, n = 0; i < pScene->mNumMeshes;++i) {
        meshes[i].vertex_format = GetMeshVFormatUnique(pScene->mMeshes[i]);

        if (meshes[i].instance_cnt > 1 && meshes[i].output_id == NotSet ) {
            meshes[i].output_id = n++;
            output.push_back(mScene->mMeshes[i]);
        }
    }

    // and process all nodes in the scenegraph recursively
    ProcessNode(pScene->mRootNode);
    if (!output.size()) {
        throw DeadlyImportError("OptimizeMeshes: No meshes remaining; there's definitely something wrong");
    }

    meshes.resize( 0 );
    ai_assert(output.size() <= num_old);

    mScene->mNumMeshes = static_cast<unsigned int>(output.size());
    std::copy(output.begin(),output.end(),mScene->mMeshes);

    if (output.size() != num_old) {
        ASSIMP_LOG_DEBUG_F("OptimizeMeshesProcess finished. Input meshes: ", num_old, ", Output meshes: ", pScene->mNumMeshes);
    } else {
        ASSIMP_LOG_DEBUG( "OptimizeMeshesProcess finished" );
    }
}